

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::validateKTXglFormat(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  _khr_df_model_e _Var2;
  undefined8 uVar3;
  ktxSupercmpScheme extraout_EDX;
  ktxSupercmpScheme scheme;
  uint32_t size_local;
  undefined8 local_58;
  uint local_50 [2];
  string local_48;
  
  this->foundKTXglFormat = true;
  uVar1 = (this->header).vkFormat;
  scheme = size;
  size_local = size;
  if (uVar1 != 0) {
    toString_abi_cxx11_(&local_48,(ktx *)(ulong)uVar1,size);
    error<std::__cxx11::string>(this,&Metadata::KTXglFormatWithVkFormat,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    scheme = extraout_EDX;
  }
  if (size == 0xc) {
    uVar3 = *(undefined8 *)data;
    local_50[0] = *(uint *)(data + 8);
    local_58._4_4_ = (int)((ulong)uVar3 >> 0x20);
    if (local_50[0] != 0 || local_58._4_4_ != 0) {
      local_58 = uVar3;
      if ((this->header).supercompressionScheme == 1) {
        toString_abi_cxx11_(&local_48,(ktx *)0x1,scheme);
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  (this,&Metadata::KTXglFormatInvalidValueForCompressed,
                   (uint *)((long)&local_58 + 4),local_50,&local_48);
      }
      else {
        if ((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
            super__Optional_payload_base<_khr_df_model_e>._M_engaged != true) {
          return;
        }
        _Var2 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>.
                _M_payload.super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value;
        if ((int)_Var2 < 0x80) {
          return;
        }
        toString_abi_cxx11_(&local_48,(ktx *)(ulong)_Var2,scheme);
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  (this,&Metadata::KTXglFormatInvalidValueForCompressed,
                   (uint *)((long)&local_58 + 4),local_50,&local_48);
      }
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else {
    error<unsigned_int&>(this,&Metadata::KTXglFormatInvalidSize,&size_local);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXglFormat(const uint8_t* data, uint32_t size) {
    foundKTXglFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXglFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 12) {
        error(Metadata::KTXglFormatInvalidSize, size);
        return;
    }

    struct Value {
        uint32_t glInternalformat = 0;
        uint32_t glFormat = 0;
        uint32_t glType = 0;
    };

    Value value{};
    std::memcpy(&value, data, size);

    if (value.glFormat != 0 || value.glType != 0) {
        if (isSupercompressionBlockCompressed(ktxSupercmpScheme(header.supercompressionScheme)))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(ktxSupercmpScheme(header.supercompressionScheme)));

        else if (parsedColorModel && isColorModelBlockCompressed(*parsedColorModel))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(*parsedColorModel));
    }
}